

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void TrackGlobalIntAssignmentsForknopDotProps
               (ParseNodePtr knopDotNode,ByteCodeGenerator *byteCodeGenerator)

{
  ParseNode *pnode;
  Symbol *this;
  code *pcVar1;
  bool bVar2;
  PropertyId PVar3;
  undefined4 *puVar4;
  ParseNodeBin *pPVar5;
  ParseNodeName *this_00;
  ParseNodeName *pPVar6;
  bool local_3d;
  PropertyId propertyId_1;
  Symbol *sym;
  PropertyId propertyId;
  bool isSymGlobalAndSingleAssignment;
  ParseNodeName *propertyNode;
  ParseNodePtr objectNode;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodePtr knopDotNode_local;
  
  if (knopDotNode->nop != knopDot) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2b26,"(knopDotNode->nop == knopDot)","knopDotNode->nop == knopDot");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pPVar5 = ParseNode::AsParseNodeBin(knopDotNode);
  pnode = pPVar5->pnode1;
  pPVar5 = ParseNode::AsParseNodeBin(knopDotNode);
  this_00 = ParseNode::AsParseNodeName(pPVar5->pnode2);
  if (pnode->nop == knopName) {
    bVar2 = ByteCodeGenerator::IsThis(pnode);
    if (bVar2) {
      bVar2 = Ident::IsSingleAssignment(this_00->pid);
      PVar3 = ParseNodeName::PropertyIdFromNameNode(this_00);
      TrackIntConstantsOnGlobalObject(byteCodeGenerator,bVar2,PVar3);
    }
    else {
      pPVar6 = ParseNode::AsParseNodeName(pnode);
      this = pPVar6->sym;
      local_3d = false;
      if (this != (Symbol *)0x0) {
        bVar2 = Symbol::GetIsGlobal(this);
        local_3d = false;
        if (bVar2) {
          bVar2 = Symbol::IsAssignedOnce(this);
          local_3d = false;
          if (bVar2) {
            local_3d = Ident::IsSingleAssignment(this_00->pid);
          }
        }
      }
      PVar3 = ParseNodeName::PropertyIdFromNameNode(this_00);
      TrackIntConstantsOnGlobalUserObject(byteCodeGenerator,local_3d,PVar3);
    }
  }
  return;
}

Assistant:

void TrackGlobalIntAssignmentsForknopDotProps(ParseNodePtr knopDotNode, ByteCodeGenerator * byteCodeGenerator)
{
    Assert(knopDotNode->nop == knopDot);

    ParseNodePtr objectNode = knopDotNode->AsParseNodeBin()->pnode1;
    ParseNodeName * propertyNode = knopDotNode->AsParseNodeBin()->pnode2->AsParseNodeName();
    bool isSymGlobalAndSingleAssignment = false;

    if (objectNode->nop == knopName)
    {
        if (ByteCodeGenerator::IsThis(objectNode))
        {
            // Assume 'this' always refer to GlobalObject
            // Cases like "this.a = "
            isSymGlobalAndSingleAssignment = propertyNode->pid->IsSingleAssignment();
            Js::PropertyId propertyId = propertyNode->PropertyIdFromNameNode();
            TrackIntConstantsOnGlobalObject(byteCodeGenerator, isSymGlobalAndSingleAssignment, propertyId);
        }
        else
        {
            Symbol * sym = objectNode->AsParseNodeName()->sym;
            isSymGlobalAndSingleAssignment = sym && sym->GetIsGlobal() && sym->IsAssignedOnce() && propertyNode->pid->IsSingleAssignment();
            Js::PropertyId propertyId = propertyNode->PropertyIdFromNameNode();
            TrackIntConstantsOnGlobalUserObject(byteCodeGenerator, isSymGlobalAndSingleAssignment, propertyId);
        }
    }
}